

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# guid_test.cpp
# Opt level: O3

void __thiscall
bidfx_public_api::tools::GUIDTest_test_guid_string_is_hex_Test::TestBody
          (GUIDTest_test_guid_string_is_hex_Test *this)

{
  byte bVar1;
  bool bVar2;
  ulong uVar3;
  char *in_R9;
  int iVar4;
  AssertionResult gtest_ar_;
  string string_val;
  GUID guid;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_a0;
  internal local_98 [8];
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_90;
  AssertHelper local_88;
  long *local_80;
  ulong local_78;
  long local_70 [2];
  string local_60;
  GUID local_40 [16];
  
  iVar4 = 0;
  do {
    bidfx_public_api::tools::GUID::GUID(local_40);
    bidfx_public_api::tools::GUID::ToString_abi_cxx11_();
    if (local_78 != 0) {
      uVar3 = 0;
      do {
        bVar1 = *(byte *)((long)local_80 + uVar3);
        if ((char)bVar1 < '0') {
LAB_001e04e0:
          local_98[0] = (internal)0x0;
LAB_001e04ee:
          local_90.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
          testing::Message::Message((Message *)&local_a0);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    (&local_60,local_98,
                     (AssertionResult *)
                     "string_val[i] >= \'0\' && string_val[i] <= \'9\' || string_val[i] >= \'A\' && string_val[i] <= \'F\' || string_val[i] >= \'a\' && string_val[i] <= \'f\'"
                     ,"false","true",in_R9);
          testing::internal::AssertHelper::AssertHelper
                    (&local_88,kFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/tools/guid_test.cpp"
                     ,0x33,local_60._M_dataplus._M_p);
          testing::internal::AssertHelper::operator=(&local_88,(Message *)&local_a0);
          testing::internal::AssertHelper::~AssertHelper(&local_88);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_60._M_dataplus._M_p != &local_60.field_2) {
            operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
          }
          if (((local_a0.ptr_ !=
                (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) &&
              (bVar2 = testing::internal::IsTrue(true), bVar2)) &&
             (local_a0.ptr_ !=
              (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
            (**(code **)(*(long *)local_a0.ptr_ + 8))();
          }
          testing::internal::
          scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::reset(&local_90,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
                 );
          if (local_80 != local_70) {
            operator_delete(local_80,local_70[0] + 1);
          }
          bidfx_public_api::tools::GUID::~GUID(local_40);
          return;
        }
        if (bVar1 < 0x3a) {
LAB_001e0472:
          local_98[0] = (internal)0x1;
        }
        else {
          if (bVar1 < 0x41) goto LAB_001e04e0;
          if (bVar1 < 0x47) goto LAB_001e0472;
          if (bVar1 < 0x61) goto LAB_001e04e0;
          local_98[0] = (internal)(bVar1 < 0x67);
          if (!(bool)local_98[0]) goto LAB_001e04ee;
        }
        local_90.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
        testing::internal::
        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::reset(&local_90,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
        uVar3 = uVar3 + 1;
      } while (uVar3 < local_78);
    }
    if (local_80 != local_70) {
      operator_delete(local_80,local_70[0] + 1);
    }
    bidfx_public_api::tools::GUID::~GUID(local_40);
    iVar4 = iVar4 + 1;
    if (iVar4 == 1000) {
      return;
    }
  } while( true );
}

Assistant:

TEST_F(GUIDTest, test_guid_string_is_hex)
{
    for (int it = 0; it < 1000; it++)
    {
        GUID guid;
        std::string string_val = guid.ToString();
        for (int i = 0; i < string_val.size(); i++)
        {
            ASSERT_TRUE(string_val[i] >= '0' && string_val[i] <= '9' ||
                        string_val[i] >= 'A' && string_val[i] <= 'F' ||
                        string_val[i] >= 'a' && string_val[i] <= 'f');
        }
    }
}